

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O1

bool __thiscall anon_unknown.dwarf_38a::NinjaMain::OpenDepsLog(NinjaMain *this,bool recompact_only)

{
  DepsLog *this_00;
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  LoadStatus LVar5;
  long *plVar6;
  ulong *puVar7;
  string err;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,".ninja_deps","");
  sVar1 = (this->build_dir_)._M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (this->build_dir_)._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)local_50);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_50,(ulong)local_70._M_dataplus._M_p);
    puVar7 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_90.field_2._M_allocated_capacity = *puVar7;
      local_90.field_2._8_8_ = plVar6[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *puVar7;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)puVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity =
       local_90.field_2._M_allocated_capacity & 0xffffffffffffff00;
  this_00 = &this->deps_log_;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  LVar5 = DepsLog::Load(this_00,&local_70,&this->state_,&local_90);
  if (LVar5 == LOAD_ERROR) {
    bVar3 = false;
    Error("loading deps log %s: %s",local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  }
  else {
    if (local_90._M_string_length != 0) {
      Warning("%s",local_90._M_dataplus._M_p);
      local_90._M_string_length = 0;
      *local_90._M_dataplus._M_p = '\0';
    }
    if (recompact_only) {
      bVar3 = true;
      if (LVar5 != LOAD_NOT_FOUND) {
        bVar3 = DepsLog::Recompact(this_00,&local_70,&local_90);
        if (!bVar3) {
          Error("failed recompaction: %s",local_90._M_dataplus._M_p);
        }
      }
    }
    else {
      bVar3 = true;
      if (this->config_->dry_run == false) {
        bVar4 = DepsLog::OpenForWrite(this_00,&local_70,&local_90);
        if (!bVar4) {
          bVar3 = false;
          Error("opening deps log: %s",local_90._M_dataplus._M_p);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool NinjaMain::OpenDepsLog(bool recompact_only) {
  string path = ".ninja_deps";
  if (!build_dir_.empty())
    path = build_dir_ + "/" + path;

  string err;
  const LoadStatus status = deps_log_.Load(path, &state_, &err);
  if (status == LOAD_ERROR) {
    Error("loading deps log %s: %s", path.c_str(), err.c_str());
    return false;
  }
  if (!err.empty()) {
    // Hack: Load() can return a warning via err by returning LOAD_SUCCESS.
    Warning("%s", err.c_str());
    err.clear();
  }

  if (recompact_only) {
    if (status == LOAD_NOT_FOUND) {
      return true;
    }
    bool success = deps_log_.Recompact(path, &err);
    if (!success)
      Error("failed recompaction: %s", err.c_str());
    return success;
  }

  if (!config_.dry_run) {
    if (!deps_log_.OpenForWrite(path, &err)) {
      Error("opening deps log: %s", err.c_str());
      return false;
    }
  }

  return true;
}